

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_jit.c
# Opt level: O3

int lj_cf_jit_status(lua_State *L)

{
  uint uVar1;
  ulong uVar2;
  
  uVar2 = (ulong)(L->glref).ptr32;
  uVar1 = *(uint *)(uVar2 + 0x2d8);
  L->top = L->base + 1;
  (L->base->field_2).it = -(uVar1 & 1) - 2;
  flagbits_to_strings(L,*(uint32_t *)(uVar2 + 0x2d8),0x10,"\x04SSE3\x06SSE4.1\x04BMI2");
  flagbits_to_strings(L,*(uint32_t *)(uVar2 + 0x2d8),0x10000,
                      "\x04fold\x03cse\x03dce\x03fwd\x03dse\x06narrow\x04loop\x03abc\x04sink\x04fuse\x03fma"
                     );
  return (int)((ulong)((long)L->top - (long)L->base) >> 3);
}

Assistant:

LJLIB_CF(jit_status)
{
#if LJ_HASJIT
  jit_State *J = L2J(L);
  L->top = L->base;
  setboolV(L->top++, (J->flags & JIT_F_ON) ? 1 : 0);
  flagbits_to_strings(L, J->flags, JIT_F_CPU, JIT_F_CPUSTRING);
  flagbits_to_strings(L, J->flags, JIT_F_OPT, JIT_F_OPTSTRING);
  return (int)(L->top - L->base);
#else
  setboolV(L->top++, 0);
  return 1;
#endif
}